

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void __thiscall SpotLight_Sampling_Test::~SpotLight_Sampling_Test(SpotLight_Sampling_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SpotLight, Sampling) {
    static ConstantSpectrum I(10.);
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);

    int widthStart[][2] = {{50, 0}, {40, 10}, {60, 5}, {70, 70}};
    Transform id;
    for (auto ws : widthStart) {
        SpotLight light(id, MediumInterface(), &I, 1.f /* scale */,
                        ws[0] /* total width */, ws[1] /* falloff start */,
                        Allocator());

        RNG rng;
        for (int i = 0; i < 100; ++i) {
            Point2f u1{rng.Uniform<Float>(), rng.Uniform<Float>()};
            Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<LightLeSample> ls =
                light.SampleLe(u1, u2, lambda, 0 /* time */);
            EXPECT_TRUE(ls.has_value());
            EXPECT_TRUE(ls->ray.o == Point3f(0, 0, 0));
            EXPECT_EQ(1, ls->pdfPos);
            // Importance should be perfect, so a single sample should
            // compute power with zero variance.
            EXPECT_LT(std::abs(light.Phi(lambda)[0] - (ls->L / ls->pdfDir)[0]), 1e-3);
        }
    }
}